

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsOn(char *val)

{
  int iVar1;
  size_t sVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  key_type local_28;
  
  if ((val == (char *)0x0) || (sVar2 = strlen(val), 4 < sVar2)) {
    bVar5 = false;
  }
  else {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,val,val + sVar2);
    if ((IsOn(char_const*)::onValues_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&IsOn(char_const*)::onValues_abi_cxx11_), iVar1 != 0)) {
      IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = (_Base_ptr)0x0;
      IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&IsOn(char_const*)::onValues_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IsOn(char_const*)::onValues_abi_cxx11_);
    }
    _Var4._M_p = local_28._M_dataplus._M_p;
    if (IsOn(char_const*)::onValues_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
       ) {
      std::__cxx11::string::string((string *)&local_48,"ON",&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&IsOn(char_const*)::onValues_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string((string *)&local_48,"1",&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&IsOn(char_const*)::onValues_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string((string *)&local_48,"YES",&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&IsOn(char_const*)::onValues_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string((string *)&local_48,"TRUE",&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&IsOn(char_const*)::onValues_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string((string *)&local_48,"Y",&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&IsOn(char_const*)::onValues_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      _Var4._M_p = local_28._M_dataplus._M_p;
    }
    for (; _Var4._M_p != local_28._M_dataplus._M_p + local_28._M_string_length;
        _Var4._M_p = (pointer)(_Var4._M_p + 1)) {
      iVar1 = toupper((int)*_Var4._M_p);
      *_Var4._M_p = (char)iVar1;
    }
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&IsOn(char_const*)::onValues_abi_cxx11_,&local_28);
    bVar5 = sVar3 != 0;
    std::__cxx11::string::~string((string *)&local_28);
  }
  return bVar5;
}

Assistant:

bool cmSystemTools::IsOn(const char* val)
{
  if (!val)
    {
    return false;
    }
  size_t len = strlen(val);
  if (len > 4)
    {
    return false;
    }
  std::basic_string<char> v(val, len);

  static std::set<std::string> onValues;
  if(onValues.empty())
    {
    onValues.insert("ON");
    onValues.insert("1");
    onValues.insert("YES");
    onValues.insert("TRUE");
    onValues.insert("Y");
    }
  for(std::basic_string<char>::iterator c = v.begin();
      c != v.end(); c++)
    {
    *c = static_cast<char>(toupper(*c));
    }
  return (onValues.count(v) > 0);
}